

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O2

bool __thiscall
Saturation::PredicateSplitPassiveClauseContainer::allChildrenNecessarilyExceedLimits
          (PredicateSplitPassiveClauseContainer *this,Clause *cl,uint upperBoundNumSelLits)

{
  pointer puVar1;
  PassiveClauseContainer *pPVar2;
  pointer puVar3;
  char cVar4;
  pointer puVar5;
  unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  *queue;
  
  puVar1 = (this->_queues).
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->_queues).
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar5 = puVar3;
    if (puVar5 == puVar1) break;
    pPVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
             ._M_t.
             super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
             .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl;
    cVar4 = (**(code **)(*(long *)&(pPVar2->super_RandomAccessClauseContainer).super_ClauseContainer
                        + 0x70))(pPVar2,cl,upperBoundNumSelLits);
    puVar3 = puVar5 + 1;
  } while (cVar4 != '\0');
  return puVar5 == puVar1;
}

Assistant:

bool PredicateSplitPassiveClauseContainer::allChildrenNecessarilyExceedLimits(Clause* cl, unsigned upperBoundNumSelLits) const
{
  // can't conclude any lower bounds on niceness of child-clause, so have to assume that it is potentially added to all queues.
  // In particular we need to check whether at least one of the queues could potentially select children of the clause.
  for (const auto& queue : _queues) {
    if (!queue->allChildrenNecessarilyExceedLimits(cl, upperBoundNumSelLits))
      return false;
  }
  return true;
}